

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  long lVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  int iVar6;
  ulong uVar7;
  int **ppiVar8;
  size_t sVar9;
  int **ppiVar10;
  long lVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  undefined1 local_eb [2];
  undefined1 local_e9 [9];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_e0;
  format_specs<char> *local_d8;
  float_specs local_d0;
  int local_c4;
  undefined1 local_c0 [20];
  undefined1 auStack_ac [20];
  float_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d0 = (float_specs)f->significand;
  local_e9._5_4_ = f->significand_size;
  local_e9[0] = '0';
  local_eb[1] = fspecs._5_1_;
  local_78 = fspecs;
  if ((int)local_e9._5_4_ < 0) {
LAB_0013787f:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                ,0x189,"negative value");
  }
  uVar20 = (ulong)((local_e9._5_4_ + 1) - (uint)(local_eb[1] == none));
  uVar12 = fspecs._4_4_;
  local_eb[0] = '.';
  if ((uVar12 >> 0x11 & 1) != 0) {
    local_e0.container = (buffer<char> *)f;
    local_d8 = specs;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_c0);
    }
    else {
      std::locale::locale((locale *)local_c0,(locale *)loc.locale_);
    }
    pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_c0);
    cVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
    std::locale::~locale((locale *)local_c0);
    f = (big_decimal_fp *)local_e0;
    specs = local_d8;
    local_eb[0] = cVar1;
  }
  uVar13 = auStack_ac._4_8_;
  uVar15 = *(int *)((long)&((buffer<char> *)f)->ptr_ + 4);
  iVar16 = local_e9._5_4_ + uVar15;
  iVar6 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001374d7:
    iVar19 = local_e9._5_4_ + uVar15 + -1;
    if ((uVar12 >> 0x13 & 1) == 0) {
      uVar7 = 0;
      if (local_e9._5_4_ == 1) {
        local_eb[0] = '\0';
        uVar7 = 0;
      }
    }
    else {
      uVar7 = 0;
      if (0 < iVar6 - local_e9._5_4_) {
        uVar7 = (ulong)(uint)(iVar6 - local_e9._5_4_);
      }
      uVar20 = uVar20 + uVar7;
    }
    local_c0[0] = local_eb[1];
    local_c0._8_8_ = local_d0;
    auStack_ac[0] = local_eb[0];
    local_c0._16_4_ = local_e9._5_4_;
    auStack_ac._4_5_ = CONCAT14('0',(int)uVar7);
    auStack_ac._10_2_ = SUB82(uVar13,6);
    auStack_ac._4_8_ =
         CONCAT26(auStack_ac._10_2_,CONCAT15(((uVar12 >> 0x10 & 1) == 0) << 5,auStack_ac._4_5_)) |
         0x450000000000;
    auStack_ac._12_4_ = iVar19;
    if (0 < specs->width) {
      if (iVar16 < 1) {
        iVar19 = 1 - iVar16;
      }
      lVar11 = 2;
      if (99 < iVar19) {
        lVar11 = (ulong)(999 < iVar19) + 3;
      }
      sVar9 = uVar20 + (3 - (ulong)(local_eb[0] == '\0')) + lVar11;
      aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,sVar9,sVar9,(anon_class_40_8_dbbf3351 *)local_c0);
      return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    }
    uVar18 = local_eb[0];
    iVar6 = local_e9._5_4_;
    if ((ulong)(byte)local_eb[1] != 0) {
      cVar1 = ""[(byte)local_eb[1]];
      lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x10);
      uVar20 = lVar11 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar20) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)();
        lVar11 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        uVar20 = lVar11 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar20;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar11) = cVar1;
      uVar18 = auStack_ac[0];
      iVar6 = local_c0._16_4_;
    }
    bVar4.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,char>(out,(char *)local_c0._8_8_,iVar6,1,uVar18);
    if (0 < (int)auStack_ac._4_4_) {
      bVar4.container =
           (buffer<char> *)
           fill_n<fmt::v10::appender,int,char>
                     ((appender)bVar4.container,auStack_ac._4_4_,auStack_ac + 8);
    }
    uVar18 = auStack_ac[9];
    sVar9 = (bVar4.container)->size_;
    uVar20 = sVar9 + 1;
    if ((bVar4.container)->capacity_ < uVar20) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      sVar9 = (bVar4.container)->size_;
      uVar20 = sVar9 + 1;
    }
    (bVar4.container)->size_ = uVar20;
    (bVar4.container)->ptr_[sVar9] = uVar18;
    aVar5 = write_exponent<char,fmt::v10::appender>(auStack_ac._12_4_,(appender)bVar4.container);
    return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar19 = 0x10;
    if (0 < iVar6) {
      iVar19 = iVar6;
    }
    if ((iVar16 < -3) || (iVar19 < iVar16)) goto LAB_001374d7;
  }
  local_c4 = iVar16;
  if ((int)uVar15 < 0) {
    if (iVar16 < 1) {
      iVar17 = -iVar16;
      iVar19 = iVar17;
      if (SBORROW4(iVar6,iVar17) != iVar6 + iVar16 < 0) {
        iVar19 = iVar6;
      }
      if (iVar6 < 0) {
        iVar19 = iVar17;
      }
      if (local_e9._5_4_ != 0) {
        iVar19 = iVar17;
      }
      local_70._M_allocated_capacity._0_4_ = iVar19;
      if (local_e9._5_4_ == 0 && iVar19 == 0) {
        local_e9[1] = (char)((uVar12 & 0x80000) >> 0x13);
        iVar6 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_e9[1] = 1;
        iVar6 = 2;
        if (iVar19 < 0) goto LAB_0013787f;
      }
      sVar9 = (uint)(iVar6 + iVar19) + uVar20;
      local_c0._0_8_ = local_eb + 1;
      local_c0._8_8_ = local_eb + 2;
      unique0x100004fa = local_e9 + 1;
      auStack_ac._4_8_ = local_eb;
      auStack_ac._12_8_ = &local_70;
      local_98 = &local_d0;
      local_90._M_allocated_capacity = (size_type)(local_e9 + 5);
      aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                        (out,specs,sVar9,sVar9,(anon_class_56_7_162c6e41 *)local_c0);
      return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    }
    iVar19 = 0;
    local_e9._1_4_ = iVar6 - local_e9._5_4_ & (int)(uVar12 << 0xc) >> 0x1f;
    uVar15 = local_e9._1_4_;
    if ((int)local_e9._1_4_ < 1) {
      uVar15 = 0;
    }
    local_e0 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    local_d8 = specs;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
    if (local_98 != (float_specs *)0x0) {
      ppiVar8 = (int **)((long)(int *)local_c0._8_8_ + local_c0._0_8_);
      lVar11 = 0;
      ppiVar10 = (int **)local_c0._0_8_;
      do {
        if (ppiVar10 == ppiVar8) {
          cVar1 = *(char *)((long)ppiVar8 + -1);
          ppiVar10 = ppiVar8;
        }
        else {
          cVar1 = *(char *)ppiVar10;
          if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_001378a3;
          ppiVar10 = (int **)((long)ppiVar10 + 1);
        }
        iVar19 = iVar19 + cVar1;
        if (iVar16 <= iVar19) goto LAB_001378a3;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    lVar11 = 0;
LAB_001378a3:
    sVar9 = uVar15 + uVar20 + lVar11 + 1;
    local_70._M_allocated_capacity = (size_type)(local_eb + 1);
    local_70._8_8_ = &local_d0;
    local_60 = (int *)(local_e9 + 5);
    local_58 = &local_c4;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_eb;
    local_40._M_allocated_capacity = (size_type)(local_e9 + 1);
    local_40._8_8_ = local_eb + 2;
    local_48 = (digit_grouping<char> *)local_c0;
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                   (local_e0.container,local_d8,sVar9,sVar9,(anon_class_64_8_e6ffa566 *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_ac._12_8_ != &local_90) {
      operator_delete((void *)auStack_ac._12_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
    uVar13 = stack0xffffffffffffff50;
    uVar14 = local_c0._0_8_;
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return (appender)bVar4.container;
    }
  }
  else {
    lVar11 = uVar15 + uVar20;
    local_e9._1_4_ = iVar6 - iVar16;
    if ((uVar12 >> 0x13 & 1) != 0) {
      lVar11 = lVar11 + 1;
      if (fspecs._4_1_ == '\x02' || 0 < (int)local_e9._1_4_) {
        if (0 < (int)local_e9._1_4_) {
          lVar11 = lVar11 + (ulong)(uint)local_e9._1_4_;
        }
      }
      else {
        local_e9._1_4_ = 0;
      }
    }
    local_e0.container = (buffer<char> *)f;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
    iVar6 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar10 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar13 = local_70._M_allocated_capacity;
      do {
        if ((int **)uVar13 == ppiVar10) {
          cVar1 = *(char *)((long)ppiVar10 + -1);
          uVar13 = ppiVar10;
        }
        else {
          cVar1 = *(char *)uVar13;
          if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_0013779a;
          uVar13 = (int **)(uVar13 + 1);
        }
        iVar6 = iVar6 + cVar1;
        if (iVar16 <= iVar6) goto LAB_0013779a;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_0013779a:
    local_c0._0_8_ = local_eb + 1;
    local_c0._8_8_ = &local_d0;
    unique0x00004e80 = local_e9 + 5;
    auStack_ac._4_8_ = local_e0.container;
    local_98 = &local_78;
    local_90._M_allocated_capacity = (size_type)local_eb;
    local_90._8_8_ = local_e9 + 1;
    local_80 = local_eb + 2;
    auStack_ac._12_8_ = &local_70;
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                   (out,specs,lVar11 + lVar3,lVar11 + lVar3,(anon_class_72_9_0c6a3a8a *)local_c0);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar13 = local_60;
    uVar14 = local_70._M_allocated_capacity;
    if ((int **)local_70._M_allocated_capacity == &local_60) {
      return (appender)bVar4.container;
    }
  }
  operator_delete((void *)uVar14,(ulong)(uVar13 + 1));
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}